

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkSignedByteText_TestShell::~TEST_TestHarness_c_checkSignedByteText_TestShell
          (TEST_TestHarness_c_checkSignedByteText_TestShell *this)

{
  TEST_TestHarness_c_checkSignedByteText_TestShell *this_local;
  
  ~TEST_TestHarness_c_checkSignedByteText_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestHarness_c, checkSignedByteText)
{
    CHECK_EQUAL_C_SBYTE_TEXT(-3, -3, "Text");
    fixture->setTestFunction(failSignedByteTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <-3>\n\tbut was  <-5>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: SignedByteTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}